

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O1

bool __thiscall DiskTableNode::valid(DiskTableNode *this,SSTableDataEntry *s)

{
  return 0 < s->timestamp;
}

Assistant:

bool DiskTableNode::valid(const SSTableDataEntry &s) {
    return s.timestamp >
           0; // getEntry return an entry whose timestamp is 0 to indicate that there is no key in the sstable.
    /* We can not add check of delete_flag of s in this method, which is used to indicate whether found given
     key in the DiskNode, though the key is marked deleted in corresponding sstable, it's do in that sstable,
     and expected behavior is terminating search in DiskTable, not continue to search other sstable like there is
     no given key in the sstable.*/
}